

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

bool __thiscall
front::syntax::SyntaxAnalyze::try_word(SyntaxAnalyze *this,int n,Token tk1,Token tk2,Token tk3)

{
  bool bVar1;
  bool bVar2;
  
  if ((long)n + this->matched_index <
      (ulong)(((long)(this->word_list->
                     super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->word_list->
                     super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)) {
    bVar1 = try_word(this,n,tk1);
    bVar2 = true;
    if (!bVar1) {
      bVar1 = try_word(this,n,tk2);
      if (!bVar1) {
        bVar2 = try_word(this,n,tk3);
        return bVar2;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SyntaxAnalyze::try_word(int n, Token tk1, Token tk2, Token tk3) {
  bool return_value = false;
  if (matched_index + n < word_list.size()) {
    return_value = try_word(n, tk1) || try_word(n, tk2) || try_word(n, tk3);
  }
  return return_value;
}